

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this)

{
  ~IfcMechanicalFastenerType(this);
  operator_delete(this);
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}